

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::TypeParameterizedTestSuite<$512f2923$>::Register
               (char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  TypedTestSuitePState *pTVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  const_iterator cVar10;
  CodeLocation *pCVar11;
  undefined8 extraout_RAX;
  ulong uVar12;
  char *pcVar13;
  string test_name;
  allocator<char> local_109;
  char *local_108;
  TypedTestSuitePState *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  char *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  key_type local_c0;
  CodeLocation local_a0;
  CodeLocation local_78;
  string local_50;
  
  local_d0 = prefix;
  local_c8 = type_names;
  RegisterTypeParameterizedTestSuiteInstantiation(case_name);
  pcVar9 = strchr(test_names,0x2c);
  if (pcVar9 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,test_names,&local_109);
  }
  else {
    local_f8 = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,test_names,pcVar9);
  }
  local_c0._M_dataplus._M_p = (pointer)local_f8;
  local_108 = case_name;
  local_100 = state;
  if (local_f0 != 0) {
    pcVar9 = local_f8->_M_local_buf + local_f0;
    do {
      paVar2 = local_f8;
      iVar8 = isspace((uint)(byte)pcVar9[-1]);
      local_c0._M_dataplus._M_p = (pointer)paVar2;
      if (iVar8 == 0) break;
      pcVar13 = pcVar9 + -1;
      uVar12 = (long)pcVar13 - (long)paVar2;
      std::__cxx11::string::_M_erase((ulong)&local_f8,uVar12);
      pcVar9 = local_f8->_M_local_buf + uVar12;
      local_c0._M_dataplus._M_p = (pointer)local_f8;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar13 != paVar2);
  }
  pTVar6 = local_100;
  pcVar9 = local_108;
  local_d8 = &local_c0.field_2;
  local_f8 = &local_e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == local_f8) {
    local_c0.field_2._8_8_ = local_e8._8_8_;
    local_c0._M_dataplus._M_p = (pointer)local_d8;
  }
  local_c0.field_2._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
  local_c0.field_2._M_local_buf[0] = local_e8._M_local_buf[0];
  local_c0._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
           ::find(&(local_100->registered_tests_)._M_t,&local_c0);
  p_Var1 = &(pTVar6->registered_tests_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar10._M_node == p_Var1) {
    FormatFileLocation_abi_cxx11_
              (&local_50,(internal *)(code_location->file)._M_dataplus._M_p,
               (char *)(ulong)(uint)code_location->line,(int)p_Var1);
    TypeParameterizedTestSuite<phmap::priv::ConstructorTest,testing::internal::Templates<phmap::priv::gtest_suite_ConstructorTest_::InitializerListBucketHashEqualAlloc,phmap::priv::gtest_suite_ConstructorTest_::InitializerListBucketAlloc,phmap::priv::gtest_suite_ConstructorTest_::InitializerListBucketHashAlloc,phmap::priv::gtest_suite_ConstructorTest_::Assignment,phmap::priv::gtest_suite_ConstructorTest_::MoveAssignment,phmap::priv::gtest_suite_ConstructorTest_::AssignmentFromInitializerList,phmap::priv::gtest_suite_ConstructorTest_::AssignmentOverwritesExisting,phmap::priv::gtest_suite_ConstructorTest_::MoveAssignmentOverwritesExisting,phmap::priv::gtest_suite_ConstructorTest_::AssignmentFromInitializerListOverwritesExisting,phmap::priv::gtest_suite_ConstructorTest_::AssignmentOnSelf>,testing::internal::Types<phmap::parallel_flat_hash_map<int,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>,4ul,std::mutex>,phmap::parallel_...stingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>,4ul,std::mutex>>>
    ::Register();
    _Unwind_Resume(extraout_RAX);
  }
  pCVar11 = TypedTestSuitePState::GetCodeLocation(pTVar6,&local_c0);
  paVar2 = &local_78.file.field_2;
  pcVar5 = (pCVar11->file)._M_dataplus._M_p;
  local_78.file._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar5,pcVar5 + (pCVar11->file)._M_string_length);
  local_78.line = pCVar11->line;
  TypeParameterizedTest<phmap::priv::ConstructorTest,_testing::internal::TemplateSel<phmap::priv::gtest_suite_ConstructorTest_::InitializerListBucketHashEqualAlloc>,_testing::internal::Types<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>,_phmap::parallel_flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_std::mutex>,_phmap::parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_std::mutex>,_phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>,_phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_std::mutex>,_phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_std::mutex>_>_>
  ::Register(local_d0,&local_78,pcVar9,test_names,0,local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.file._M_dataplus._M_p,local_78.file.field_2._M_allocated_capacity + 1);
  }
  pTVar6 = local_100;
  paVar4 = &local_a0.file.field_2;
  local_a0.file._M_dataplus._M_p = (code_location->file)._M_dataplus._M_p;
  paVar2 = &(code_location->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.file._M_dataplus._M_p == paVar2) {
    local_a0.file.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_a0.file.field_2._8_8_ = *(undefined8 *)((long)&(code_location->file).field_2 + 8);
    local_a0.file._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_a0.file.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_a0.file._M_string_length = (code_location->file)._M_string_length;
  (code_location->file)._M_dataplus._M_p = (pointer)paVar2;
  (code_location->file)._M_string_length = 0;
  (code_location->file).field_2._M_local_buf[0] = '\0';
  local_a0.line = code_location->line;
  pcVar13 = strchr(test_names,0x2c);
  if (pcVar13 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    do {
      pbVar3 = (byte *)(pcVar13 + 1);
      pcVar13 = pcVar13 + 1;
      iVar8 = isspace((uint)*pbVar3);
    } while (iVar8 != 0);
  }
  bVar7 = TypeParameterizedTestSuite<$1f07171d$>::Register
                    (local_d0,&local_a0,pTVar6,pcVar9,pcVar13,local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.file._M_dataplus._M_p != paVar4) {
    operator_delete(local_a0.file._M_dataplus._M_p,local_a0.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix,
                                                       std::move(code_location),
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }